

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O2

DoublePrecision
pnga_ddot_patch_dp(Integer g_a,char *t_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                  Integer g_b,char *t_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Integer IVar4;
  Integer IVar5;
  Integer IVar6;
  Integer IVar7;
  logical lVar8;
  Integer proc;
  DoublePrecision *pDVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  DoublePrecision DVar13;
  Integer bhi [2];
  Integer blo [2];
  DoublePrecision *dbl_ptrB;
  long local_e0;
  Integer ldB;
  long local_d0;
  byte *local_c0;
  Integer local_b8;
  DoublePrecision *dbl_ptrA;
  Integer ldA;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  Integer btype;
  Integer ahi [2];
  Integer alo [2];
  Integer ndim;
  Integer atype;
  Integer dims [2];
  
  local_c0 = (byte *)t_a;
  local_b8 = pnga_nodeid();
  pnga_check_handle(g_a,"pnga_ddot_patch_dp");
  pnga_check_handle(g_b,"pnga_ddot_patch_dp");
  pnga_inquire(g_a,&atype,&ndim,dims);
  IVar5 = dims[1];
  IVar4 = dims[0];
  pnga_inquire(g_b,&btype,&ndim,dims);
  if ((atype != 0x3ec) || (btype != 0x3ec)) {
    pnga_error("pnga_ddot_patch_dp: wrong types ",0);
  }
  if ((((ailo < 1) || (ajlo < 1)) || (IVar4 < aihi)) || (IVar5 < ajhi)) {
    pnga_error(" pnga_ddot_patch_dp: g_a indices out of range ",0);
  }
  if (((bilo < 1) || (bjlo < 1)) || ((dims[0] < bihi || (dims[1] < bjhi)))) {
    pnga_error(" pnga_ddot_patch_dp: g_b indices out of range ",0);
  }
  IVar4 = local_b8;
  if (((*t_b & 0xdfU) == 0x4e) == ((*local_c0 & 0xdf) != 0x4e)) {
    pnga_error(" pnga_ddot_patch_dp: transpose operators don\'t match: ",local_b8);
  }
  pnga_distribution(g_a,IVar4,alo,ahi);
  iloA = alo[0];
  jloA = alo[1];
  ihiA = ahi[0];
  jhiA = ahi[1];
  lVar8 = patch_intersect(ailo,aihi,ajlo,ajhi,&iloA,&ihiA,&jloA,&jhiA);
  if (lVar8 == 0) {
    DVar13 = 0.0;
  }
  else {
    pnga_access_ptr(g_a,alo,ahi,&dbl_ptrA,&ldA);
    IVar7 = iloA;
    IVar6 = ihiA;
    IVar5 = jloA;
    IVar4 = jhiA;
    lVar12 = iloA + (bilo - ailo);
    pDVar9 = (DoublePrecision *)((bilo - ailo) + ihiA);
    lVar1 = jloA + (bjlo - ajlo);
    lVar11 = (bjlo - ajlo) + jhiA;
    bhi[0] = (Integer)pDVar9;
    bhi[1] = lVar11;
    blo[0] = lVar12;
    blo[1] = lVar1;
    proc = pnga_nodeid();
    pnga_distribution(g_b,proc,&ldB,(Integer *)&dbl_ptrB);
    bVar2 = lVar11 == local_e0 && lVar12 == ldB;
    bVar3 = pDVar9 == dbl_ptrB;
    if (lVar1 == local_d0 && (bVar2 && bVar3)) {
      pnga_access_ptr(g_b,blo,bhi,&dbl_ptrB,&ldB);
      lVar12 = IVar6 - IVar7;
      pDVar9 = dbl_ptrB;
    }
    else {
      lVar12 = IVar6 - IVar7;
      pDVar9 = (DoublePrecision *)
               pnga_malloc(((IVar4 - IVar5) + 1) * (lVar12 + 1),0x3f5,"ddot_dp_b");
      dbl_ptrB = pDVar9;
      ldB = lVar12 + 1;
      pnga_get(g_b,blo,bhi,pDVar9,&ldB);
    }
    DVar13 = 0.0;
    for (lVar11 = 0; lVar11 <= IVar4 - IVar5; lVar11 = lVar11 + 1) {
      for (lVar10 = 0; lVar10 <= lVar12; lVar10 = lVar10 + 1) {
        DVar13 = DVar13 + dbl_ptrA[lVar10] * pDVar9[lVar10];
      }
      dbl_ptrA = dbl_ptrA + ldA;
      pDVar9 = pDVar9 + ldB;
    }
    pnga_release(g_a,alo,ahi);
    if (lVar1 == local_d0 && (bVar2 && bVar3)) {
      pnga_release(g_b,blo,bhi);
    }
    else {
      pnga_free(dbl_ptrB);
    }
  }
  return DVar13;
}

Assistant:

DoublePrecision pnga_ddot_patch_dp(g_a, t_a, ailo, aihi, ajlo, ajhi,
                                  g_b, t_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     char    *t_a, *t_b;                          /* transpose operators */
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer iloA, ihiA, jloA, jhiA, ldA;
Integer iloB, ihiB, jloB, jhiB, ldB;
Integer alo[2], ahi[2];
Integer blo[2], bhi[2];
Integer g_A = g_a;
Integer me= pnga_nodeid(), i, j, temp_created=0;
Integer corr, nelem;
char    transp, transp_a, transp_b;
DoublePrecision  sum = 0.;
DoublePrecision *dbl_ptrA;
DoublePrecision *dbl_ptrB;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_ddot_patch_dp");
   pnga_check_handle(g_b, "pnga_ddot_patch_dp");

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_ddot_patch_dp: wrong types ", 0L);

  /* check if patch indices and g_a dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
      pnga_error(" pnga_ddot_patch_dp: g_a indices out of range ", 0L);

   /* check if patch indices and g_b dims match */
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_ddot_patch_dp: g_b indices out of range ", 0L);


   /* is transpose operation required ? */
   /* -- only if for one array transpose operation requested*/
   transp_a = (*t_a == 'n' || *t_a =='N')? 'n' : 't';
   transp_b = (*t_b == 'n' || *t_b =='N')? 'n' : 't';
   transp   = (transp_a == transp_b)? 'n' : 't';
   if(transp == 't')
          pnga_error(" pnga_ddot_patch_dp: transpose operators don't match: ", me);


   /* find out coordinates of patches of g_A and g_B that I own */
   pnga_distribution(g_A, me, alo, ahi);
   iloA = alo[0];
   jloA = alo[1];
   ihiA = ahi[0];
   jhiA = ahi[1];

   if (patch_intersect(ailo, aihi, ajlo, ajhi, &iloA, &ihiA, &jloA, &jhiA)){

       pnga_access_ptr(g_A, alo, ahi, &dbl_ptrA, &ldA);
       nelem = (ihiA-iloA+1)*(jhiA-jloA+1);

       corr  = bilo - ailo;
       iloB  = iloA + corr;
       ihiB  = ihiA + corr;
       corr  = bjlo - ajlo;
       jloB  = jloA + corr;
       jhiB  = jhiA + corr;
       blo[0] = iloB; blo[1] = jloB;
       bhi[0] = ihiB; bhi[1] = jhiB;

      if(own_patch(g_b, iloB, ihiB, jloB, jhiB)){
         /* all the data is local */
         pnga_access_ptr(g_b, blo, bhi, &dbl_ptrB, &ldB);
      }else{
         /* data is remote -- get it to temp storage*/
         temp_created =1;
	      dbl_ptrB = (DoublePrecision*)pnga_malloc(nelem, MT_F_DBL, "ddot_dp_b");

         ldB   = ihiB-iloB+1; 
         pnga_get(g_b, blo, bhi, dbl_ptrB, &ldB);
      }

      sum = 0.;
      for(j=0; j< jhiA-jloA+1; j++)
          for(i=0; i< ihiA-iloA+1; i++)
             sum += *(dbl_ptrA + j*ldA + i) * 
                    *(dbl_ptrB + j*ldB + i);
      pnga_release(g_A, alo, ahi);

      if(temp_created) pnga_free(dbl_ptrB);
      else pnga_release(g_b, blo, bhi);
   }
   return sum;
}